

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O2

int blake2b_compress(blake2b_state *S,uint8_t *block)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t m [16];
  ulong local_1c8 [8];
  ulong local_188 [8];
  long local_148 [35];
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    local_148[lVar1] = *(long *)(block + lVar1 * 8);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_1c8[lVar1] = S->h[lVar1];
  }
  uVar2 = local_1c8[0] + local_1c8[4] + local_148[0];
  uVar3 = uVar2 ^ S->t[0] ^ 0x510e527fade682d1;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[0] = uVar3 + 0x6a09e667f3bcc908;
  uVar14 = local_1c8[4] ^ local_188[0];
  uVar15 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar2 = local_148[1] + uVar2 + uVar15;
  uVar3 = uVar3 ^ uVar2;
  uVar14 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[0] = local_188[0] + uVar14;
  uVar15 = uVar15 ^ local_188[0];
  uVar16 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar3 = local_1c8[1] + local_1c8[5] + local_148[2];
  uVar15 = S->t[1] ^ uVar3 ^ 0x9b05688c2b3e6c1f;
  uVar4 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar10 = local_1c8[2] + local_1c8[6] + local_148[4];
  uVar6 = S->f[0] ^ uVar10 ^ 0x1f83d9abfb41bd6b;
  local_188[1] = uVar4 + 0xbb67ae8584caa73b;
  uVar15 = local_1c8[5] ^ local_188[1];
  uVar8 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar15 = uVar3 + local_148[3] + uVar8;
  uVar4 = uVar4 ^ uVar15;
  uVar5 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[1] = local_188[1] + uVar5;
  uVar8 = uVar8 ^ local_188[1];
  uVar9 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar3 = local_1c8[3] + local_1c8[7] + local_148[6];
  uVar4 = S->f[1] ^ uVar3 ^ 0x5be0cd19137e2179;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[2] = uVar6 + 0x3c6ef372fe94f82b;
  uVar8 = local_1c8[6] ^ local_188[2];
  uVar7 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar10 = uVar10 + local_148[5] + uVar7;
  uVar6 = uVar6 ^ uVar10;
  uVar8 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[2] = local_188[2] + uVar8;
  uVar7 = uVar7 ^ local_188[2];
  uVar7 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[3] = uVar4 + 0xa54ff53a5f1d36f1;
  uVar6 = local_1c8[7] ^ local_188[3];
  uVar6 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar3 = uVar3 + local_148[7] + uVar6;
  uVar4 = uVar4 ^ uVar3;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[3] = local_188[3] + uVar4;
  uVar6 = uVar6 ^ local_188[3];
  uVar6 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar12 = uVar2 + local_148[8] + uVar9;
  uVar4 = uVar4 ^ uVar12;
  uVar2 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[2] = local_188[2] + uVar2;
  uVar9 = uVar9 ^ local_188[2];
  uVar9 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar12 = uVar12 + local_148[9] + uVar9;
  uVar2 = uVar2 ^ uVar12;
  uVar4 = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[2] = local_188[2] + uVar4;
  uVar9 = uVar9 ^ local_188[2];
  uVar9 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar15 = uVar15 + local_148[10] + uVar7;
  uVar14 = uVar14 ^ uVar15;
  uVar2 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_188[3] = local_188[3] + uVar2;
  uVar7 = uVar7 ^ local_188[3];
  uVar7 = uVar7 << 0x28 | uVar7 >> 0x18;
  uVar15 = uVar15 + local_148[0xb] + uVar7;
  uVar2 = uVar2 ^ uVar15;
  uVar14 = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[3] = local_188[3] + uVar14;
  uVar7 = uVar7 ^ local_188[3];
  uVar7 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar10 = uVar10 + local_148[0xc] + uVar6;
  uVar5 = uVar5 ^ uVar10;
  uVar2 = uVar5 << 0x20 | uVar5 >> 0x20;
  local_188[0] = local_188[0] + uVar2;
  uVar6 = uVar6 ^ local_188[0];
  uVar6 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar10 = uVar10 + local_148[0xd] + uVar6;
  uVar2 = uVar2 ^ uVar10;
  uVar5 = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[0] = local_188[0] + uVar5;
  uVar6 = uVar6 ^ local_188[0];
  uVar6 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar2 = uVar3 + local_148[0xe] + uVar16;
  uVar8 = uVar8 ^ uVar2;
  uVar3 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[1] = local_188[1] + uVar3;
  uVar16 = uVar16 ^ local_188[1];
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar2 = uVar2 + local_148[0xf] + uVar16;
  uVar3 = uVar3 ^ uVar2;
  uVar8 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[1] = local_188[1] + uVar8;
  uVar16 = uVar16 ^ local_188[1];
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar12 = uVar12 + local_148[0xe] + uVar16;
  uVar14 = uVar14 ^ uVar12;
  uVar3 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar16 = uVar16 ^ local_188[0];
  uVar14 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar12 = uVar12 + local_148[10] + uVar14;
  uVar3 = uVar3 ^ uVar12;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[0] = local_188[0] + uVar3;
  uVar14 = uVar14 ^ local_188[0];
  uVar16 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar14 = uVar15 + local_148[4] + uVar9;
  uVar5 = uVar5 ^ uVar14;
  uVar15 = uVar5 << 0x20 | uVar5 >> 0x20;
  local_188[1] = local_188[1] + uVar15;
  uVar9 = uVar9 ^ local_188[1];
  uVar9 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar14 = uVar14 + local_148[8] + uVar9;
  uVar15 = uVar15 ^ uVar14;
  uVar5 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[1] = local_188[1] + uVar5;
  uVar9 = uVar9 ^ local_188[1];
  uVar9 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar10 = uVar10 + local_148[9] + uVar7;
  uVar8 = uVar8 ^ uVar10;
  uVar15 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[2] = local_188[2] + uVar15;
  uVar7 = uVar7 ^ local_188[2];
  uVar7 = uVar7 << 0x28 | uVar7 >> 0x18;
  uVar10 = uVar10 + local_148[0xf] + uVar7;
  uVar15 = uVar15 ^ uVar10;
  uVar8 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[2] = local_188[2] + uVar8;
  uVar7 = uVar7 ^ local_188[2];
  uVar7 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar2 = uVar2 + local_148[0xd] + uVar6;
  uVar4 = uVar4 ^ uVar2;
  uVar15 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[3] = local_188[3] + uVar15;
  uVar6 = uVar6 ^ local_188[3];
  uVar4 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar2 = uVar2 + local_148[6] + uVar4;
  uVar15 = uVar15 ^ uVar2;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[3] = local_188[3] + uVar15;
  uVar4 = uVar4 ^ local_188[3];
  uVar6 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar12 = uVar12 + local_148[1] + uVar9;
  uVar15 = uVar15 ^ uVar12;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[2] = local_188[2] + uVar15;
  uVar9 = uVar9 ^ local_188[2];
  uVar4 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar12 = uVar12 + local_148[0xc] + uVar4;
  uVar15 = uVar15 ^ uVar12;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[2] = local_188[2] + uVar15;
  uVar4 = uVar4 ^ local_188[2];
  uVar9 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar14 = uVar14 + local_148[0] + uVar7;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[3] = local_188[3] + uVar3;
  uVar7 = uVar7 ^ local_188[3];
  uVar4 = uVar7 << 0x28 | uVar7 >> 0x18;
  uVar14 = uVar14 + local_148[2] + uVar4;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[3] = local_188[3] + uVar3;
  uVar4 = uVar4 ^ local_188[3];
  uVar7 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar10 = uVar10 + local_148[0xb] + uVar6;
  uVar5 = uVar5 ^ uVar10;
  uVar4 = uVar5 << 0x20 | uVar5 >> 0x20;
  local_188[0] = local_188[0] + uVar4;
  uVar6 = uVar6 ^ local_188[0];
  uVar5 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar10 = uVar10 + local_148[7] + uVar5;
  uVar4 = uVar4 ^ uVar10;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[0] = local_188[0] + uVar4;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar2 = uVar2 + local_148[5] + uVar16;
  uVar8 = uVar8 ^ uVar2;
  uVar6 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[1] = local_188[1] + uVar6;
  uVar16 = uVar16 ^ local_188[1];
  uVar8 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar2 = uVar2 + local_148[3] + uVar8;
  uVar6 = uVar6 ^ uVar2;
  uVar6 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[1] = local_188[1] + uVar6;
  uVar8 = uVar8 ^ local_188[1];
  uVar16 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar8 = uVar12 + local_148[0xb] + uVar16;
  uVar3 = uVar3 ^ uVar8;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar16 = uVar16 ^ local_188[0];
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar12 = uVar8 + local_148[8] + uVar16;
  uVar3 = uVar3 ^ uVar12;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[0] = local_188[0] + uVar3;
  uVar16 = uVar16 ^ local_188[0];
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar14 = uVar14 + local_148[0xc] + uVar9;
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar9 = uVar9 ^ local_188[1];
  uVar8 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar14 = uVar14 + local_148[0] + uVar8;
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[1] = local_188[1] + uVar4;
  uVar8 = uVar8 ^ local_188[1];
  uVar9 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar10 = uVar10 + local_148[5] + uVar7;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar7 = uVar7 ^ local_188[2];
  uVar8 = uVar7 << 0x28 | uVar7 >> 0x18;
  uVar10 = uVar10 + local_148[2] + uVar8;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[2] = local_188[2] + uVar6;
  uVar8 = uVar8 ^ local_188[2];
  uVar8 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar2 = uVar2 + local_148[0xf] + uVar5;
  uVar15 = uVar15 ^ uVar2;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[3] = local_188[3] + uVar15;
  uVar5 = uVar5 ^ local_188[3];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar2 = uVar2 + local_148[0xd] + uVar5;
  uVar15 = uVar15 ^ uVar2;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[3] = local_188[3] + uVar15;
  uVar5 = uVar5 ^ local_188[3];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar12 = uVar12 + local_148[10] + uVar9;
  uVar15 = uVar15 ^ uVar12;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[2] = local_188[2] + uVar15;
  uVar9 = uVar9 ^ local_188[2];
  uVar7 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar12 = uVar12 + local_148[0xe] + uVar7;
  uVar15 = uVar15 ^ uVar12;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[2] = local_188[2] + uVar15;
  uVar7 = uVar7 ^ local_188[2];
  uVar7 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar14 = uVar14 + local_148[3] + uVar8;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[3] = local_188[3] + uVar3;
  uVar8 = uVar8 ^ local_188[3];
  uVar8 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar14 = uVar14 + local_148[6] + uVar8;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[3] = local_188[3] + uVar3;
  uVar8 = uVar8 ^ local_188[3];
  uVar8 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar9 = uVar10 + local_148[7] + uVar5;
  uVar4 = uVar4 ^ uVar9;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[0] = local_188[0] + uVar4;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar10 = uVar9 + local_148[1] + uVar5;
  uVar4 = uVar4 ^ uVar10;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[0] = local_188[0] + uVar4;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar2 = uVar2 + local_148[9] + uVar16;
  uVar6 = uVar6 ^ uVar2;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[1] = local_188[1] + uVar6;
  uVar16 = uVar16 ^ local_188[1];
  uVar9 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar2 = uVar2 + local_148[4] + uVar9;
  uVar6 = uVar6 ^ uVar2;
  uVar6 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[1] = local_188[1] + uVar6;
  uVar9 = uVar9 ^ local_188[1];
  uVar16 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar9 = uVar12 + local_148[7] + uVar16;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar16 = uVar16 ^ local_188[0];
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar12 = uVar9 + local_148[9] + uVar16;
  uVar3 = uVar3 ^ uVar12;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[0] = local_188[0] + uVar3;
  uVar16 = uVar16 ^ local_188[0];
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar14 = uVar14 + local_148[3] + uVar7;
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar7 = uVar7 ^ local_188[1];
  uVar7 = uVar7 << 0x28 | uVar7 >> 0x18;
  uVar14 = uVar14 + local_148[1] + uVar7;
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[1] = local_188[1] + uVar4;
  uVar7 = uVar7 ^ local_188[1];
  uVar9 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar10 = uVar10 + local_148[0xd] + uVar8;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar8 = uVar8 ^ local_188[2];
  uVar7 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar10 = uVar10 + local_148[0xc] + uVar7;
  uVar6 = uVar6 ^ uVar10;
  uVar8 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[2] = local_188[2] + uVar8;
  uVar7 = uVar7 ^ local_188[2];
  uVar6 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar2 = uVar2 + local_148[0xb] + uVar5;
  uVar15 = uVar15 ^ uVar2;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[3] = local_188[3] + uVar15;
  uVar5 = uVar5 ^ local_188[3];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar2 = uVar2 + local_148[0xe] + uVar5;
  uVar15 = uVar15 ^ uVar2;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[3] = local_188[3] + uVar15;
  uVar5 = uVar5 ^ local_188[3];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar12 = uVar12 + local_148[2] + uVar9;
  uVar15 = uVar15 ^ uVar12;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[2] = local_188[2] + uVar15;
  uVar9 = uVar9 ^ local_188[2];
  uVar7 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar12 = uVar12 + local_148[6] + uVar7;
  uVar15 = uVar15 ^ uVar12;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[2] = local_188[2] + uVar15;
  uVar7 = uVar7 ^ local_188[2];
  uVar9 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar14 = uVar14 + local_148[5] + uVar6;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[3] = local_188[3] + uVar3;
  uVar6 = uVar6 ^ local_188[3];
  uVar6 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar14 = uVar14 + local_148[10] + uVar6;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[3] = local_188[3] + uVar3;
  uVar6 = uVar6 ^ local_188[3];
  uVar7 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar6 = uVar10 + local_148[4] + uVar5;
  uVar4 = uVar4 ^ uVar6;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[0] = local_188[0] + uVar4;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar10 = uVar6 + local_148[0] + uVar5;
  uVar4 = uVar4 ^ uVar10;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[0] = local_188[0] + uVar4;
  uVar5 = uVar5 ^ local_188[0];
  uVar6 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar2 = uVar2 + local_148[0xf] + uVar16;
  uVar8 = uVar8 ^ uVar2;
  uVar5 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[1] = local_188[1] + uVar5;
  uVar16 = uVar16 ^ local_188[1];
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar2 = uVar2 + local_148[8] + uVar16;
  uVar5 = uVar5 ^ uVar2;
  uVar8 = uVar5 << 0x30 | uVar5 >> 0x10;
  local_188[1] = local_188[1] + uVar8;
  uVar16 = uVar16 ^ local_188[1];
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar5 = uVar12 + local_148[9] + uVar16;
  uVar3 = uVar3 ^ uVar5;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar16 = uVar16 ^ local_188[0];
  uVar12 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar16 = uVar5 + local_148[0] + uVar12;
  uVar3 = uVar3 ^ uVar16;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[0] = local_188[0] + uVar3;
  uVar12 = uVar12 ^ local_188[0];
  uVar17 = uVar12 << 1 | (ulong)((long)uVar12 < 0);
  uVar14 = uVar14 + local_148[5] + uVar9;
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar9 = uVar9 ^ local_188[1];
  uVar9 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar14 = uVar14 + local_148[7] + uVar9;
  uVar4 = uVar4 ^ uVar14;
  uVar5 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[1] = local_188[1] + uVar5;
  uVar9 = uVar9 ^ local_188[1];
  uVar9 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar10 = uVar10 + local_148[2] + uVar7;
  uVar8 = uVar8 ^ uVar10;
  uVar4 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[2] = local_188[2] + uVar4;
  uVar7 = uVar7 ^ local_188[2];
  uVar7 = uVar7 << 0x28 | uVar7 >> 0x18;
  uVar2 = uVar2 + local_148[10] + uVar6;
  uVar15 = uVar15 ^ uVar2;
  uVar12 = uVar10 + local_148[4] + uVar7;
  uVar4 = uVar4 ^ uVar12;
  uVar8 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[2] = local_188[2] + uVar8;
  uVar7 = uVar7 ^ local_188[2];
  uVar7 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[3] = local_188[3] + uVar15;
  uVar6 = uVar6 ^ local_188[3];
  uVar4 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar2 = uVar2 + local_148[0xf] + uVar4;
  uVar15 = uVar15 ^ uVar2;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[3] = local_188[3] + uVar15;
  uVar4 = uVar4 ^ local_188[3];
  uVar6 = uVar16 + local_148[0xe] + uVar9;
  uVar15 = uVar15 ^ uVar6;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[2] = local_188[2] + uVar15;
  uVar9 = uVar9 ^ local_188[2];
  uVar10 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar16 = uVar6 + local_148[1] + uVar10;
  uVar15 = uVar15 ^ uVar16;
  uVar14 = uVar14 + local_148[0xb] + uVar7;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[3] = local_188[3] + uVar3;
  uVar7 = uVar7 ^ local_188[3];
  uVar9 = uVar7 << 0x28 | uVar7 >> 0x18;
  uVar14 = uVar14 + local_148[0xc] + uVar9;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
  uVar2 = uVar2 + local_148[3] + uVar17;
  uVar8 = uVar8 ^ uVar2;
  uVar6 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[1] = local_188[1] + uVar6;
  uVar17 = uVar17 ^ local_188[1];
  uVar8 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar2 = uVar2 + local_148[0xd] + uVar8;
  uVar6 = uVar6 ^ uVar2;
  uVar7 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[1] = local_188[1] + uVar7;
  uVar8 = uVar8 ^ local_188[1];
  uVar17 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  local_188[3] = local_188[3] + uVar3;
  uVar16 = uVar16 + local_148[2] + uVar17;
  uVar3 = uVar3 ^ uVar16;
  uVar6 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar4 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[2] = local_188[2] + uVar4;
  uVar10 = uVar10 ^ local_188[2];
  uVar10 = uVar10 << 1 | (ulong)((long)uVar10 < 0);
  uVar8 = uVar12 + local_148[6] + uVar6;
  uVar5 = uVar5 ^ uVar8;
  uVar15 = uVar5 << 0x20 | uVar5 >> 0x20;
  local_188[0] = local_188[0] + uVar15;
  uVar6 = uVar6 ^ local_188[0];
  uVar6 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar8 = uVar8 + local_148[8] + uVar6;
  uVar15 = uVar15 ^ uVar8;
  uVar5 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[0] = local_188[0] + uVar5;
  uVar15 = uVar14 + local_148[6] + uVar10;
  uVar5 = uVar5 ^ uVar15;
  uVar9 = uVar9 ^ local_188[3];
  uVar9 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar12 = uVar8 + local_148[0] + uVar9;
  uVar7 = uVar7 ^ uVar12;
  uVar6 = uVar6 ^ local_188[0];
  uVar8 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar2 = uVar2 + local_148[8] + uVar8;
  uVar4 = uVar4 ^ uVar2;
  uVar14 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_188[0] = local_188[0] + uVar14;
  uVar17 = uVar17 ^ local_188[0];
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar16 = uVar16 + local_148[0xc] + uVar17;
  uVar14 = uVar14 ^ uVar16;
  uVar3 = uVar5 << 0x20 | uVar5 >> 0x20;
  local_188[1] = local_188[1] + uVar3;
  uVar10 = uVar10 ^ local_188[1];
  uVar5 = uVar10 << 0x28 | uVar10 >> 0x18;
  uVar15 = uVar15 + local_148[10] + uVar5;
  uVar3 = uVar3 ^ uVar15;
  uVar6 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[1] = local_188[1] + uVar6;
  uVar5 = uVar5 ^ local_188[1];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[3] = local_188[3] + uVar4;
  uVar8 = uVar8 ^ local_188[3];
  uVar8 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar3 = uVar2 + local_148[3] + uVar8;
  uVar4 = uVar4 ^ uVar3;
  uVar2 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[3] = local_188[3] + uVar2;
  uVar16 = uVar16 + local_148[4] + uVar5;
  uVar2 = uVar2 ^ uVar16;
  uVar4 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[2] = local_188[2] + uVar4;
  uVar9 = uVar9 ^ local_188[2];
  uVar9 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar12 = uVar12 + local_148[0xb] + uVar9;
  uVar4 = uVar4 ^ uVar12;
  uVar7 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[2] = local_188[2] + uVar7;
  uVar9 = uVar9 ^ local_188[2];
  uVar2 = uVar2 << 0x20 | uVar2 >> 0x20;
  local_188[2] = local_188[2] + uVar2;
  uVar5 = uVar5 ^ local_188[2];
  uVar10 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar16 = uVar16 + local_148[0xd] + uVar10;
  uVar2 = uVar2 ^ uVar16;
  uVar5 = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[2] = uVar5 + local_188[2];
  uVar2 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_188[0] = local_188[0] + uVar2;
  uVar4 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar8 = uVar8 ^ local_188[3];
  uVar10 = uVar10 ^ local_188[2];
  uVar10 = uVar10 << 1 | (ulong)((long)uVar10 < 0);
  uVar15 = uVar15 + uVar4 + local_148[7];
  uVar2 = uVar2 ^ uVar15;
  uVar14 = uVar2 << 0x20 | uVar2 >> 0x20;
  local_188[3] = local_188[3] + uVar14;
  uVar4 = uVar4 ^ local_188[3];
  uVar2 = uVar4 << 0x28 | uVar4 >> 0x18;
  uVar4 = uVar15 + local_148[5] + uVar2;
  uVar14 = uVar14 ^ uVar4;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_188[3] = local_188[3] + uVar14;
  uVar2 = local_188[3] ^ uVar2;
  uVar17 = uVar17 ^ local_188[0];
  uVar9 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar8 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar3 = uVar3 + local_148[1] + uVar9;
  uVar7 = uVar7 ^ uVar3;
  uVar15 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[1] = local_188[1] + uVar15;
  uVar9 = uVar9 ^ local_188[1];
  uVar17 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar9 = uVar12 + local_148[0xf] + uVar8;
  uVar3 = uVar3 + uVar17 + local_148[9];
  uVar6 = uVar6 ^ uVar9;
  uVar15 = uVar15 ^ uVar3;
  uVar7 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[1] = local_188[1] + uVar7;
  uVar17 = uVar17 ^ local_188[1];
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar16 = uVar16 + local_148[0xc] + uVar17;
  uVar14 = uVar14 ^ uVar16;
  uVar2 = uVar2 << 1 | (ulong)((long)uVar2 < 0);
  uVar15 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[0] = local_188[0] + uVar15;
  uVar8 = uVar8 ^ local_188[0];
  uVar8 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar12 = uVar9 + local_148[0xe] + uVar8;
  uVar15 = uVar15 ^ uVar12;
  uVar6 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[0] = local_188[0] + uVar6;
  uVar8 = uVar8 ^ local_188[0];
  uVar9 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_188[0] = local_188[0] + uVar14;
  uVar17 = uVar17 ^ local_188[0];
  uVar15 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar16 = uVar16 + local_148[5] + uVar15;
  uVar14 = uVar14 ^ uVar16;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_188[0] = uVar14 + local_188[0];
  uVar15 = local_188[0] ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar4 = uVar4 + uVar10 + local_148[1];
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[1] = local_188[1] + uVar6;
  uVar10 = uVar10 ^ local_188[1];
  uVar8 = uVar10 << 0x28 | uVar10 >> 0x18;
  uVar4 = uVar4 + local_148[0xf] + uVar8;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[1] = uVar6 + local_188[1];
  uVar8 = local_188[1] ^ uVar8;
  uVar8 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar10 = uVar12 + uVar2 + local_148[0xe];
  uVar7 = uVar7 ^ uVar10;
  uVar7 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[2] = local_188[2] + uVar7;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 << 0x28 | uVar2 >> 0x18;
  uVar17 = uVar10 + uVar2 + local_148[0xd];
  uVar7 = uVar7 ^ uVar17;
  uVar7 = uVar7 << 0x30 | uVar7 >> 0x10;
  local_188[2] = uVar7 + local_188[2];
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 << 1 | (ulong)((long)uVar2 < 0);
  uVar3 = uVar3 + uVar9 + local_148[4];
  uVar5 = uVar5 ^ uVar3;
  uVar10 = uVar5 << 0x20 | uVar5 >> 0x20;
  local_188[3] = local_188[3] + uVar10;
  uVar9 = uVar9 ^ local_188[3];
  uVar5 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar3 = uVar3 + uVar5 + local_148[10];
  uVar10 = uVar10 ^ uVar3;
  uVar10 = uVar10 << 0x30 | uVar10 >> 0x10;
  local_188[3] = local_188[3] + uVar10;
  uVar5 = uVar5 ^ local_188[3];
  uVar9 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar12 = uVar16 + uVar8 + local_148[0];
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 << 0x20 | uVar10 >> 0x20;
  local_188[2] = local_188[2] + uVar10;
  uVar8 = uVar8 ^ local_188[2];
  uVar5 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar13 = uVar12 + uVar5 + local_148[7];
  uVar10 = uVar10 ^ uVar13;
  uVar16 = uVar10 << 0x30 | uVar10 >> 0x10;
  local_188[2] = uVar16 + local_188[2];
  uVar5 = local_188[2] ^ uVar5;
  uVar12 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar4 = uVar4 + uVar2 + local_148[6];
  uVar14 = uVar14 ^ uVar4;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_188[3] = local_188[3] + uVar14;
  uVar2 = uVar2 ^ local_188[3];
  uVar2 = uVar2 << 0x28 | uVar2 >> 0x18;
  uVar4 = uVar4 + uVar2 + local_148[3];
  uVar14 = uVar14 ^ uVar4;
  uVar10 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_188[3] = local_188[3] + uVar10;
  uVar2 = local_188[3] ^ uVar2;
  uVar5 = uVar2 << 1 | (ulong)((long)uVar2 < 0);
  uVar8 = uVar17 + uVar9 + local_148[9];
  uVar6 = uVar6 ^ uVar8;
  uVar2 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[0] = local_188[0] + uVar2;
  uVar9 = uVar9 ^ local_188[0];
  uVar14 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar17 = uVar8 + uVar14 + local_148[2];
  uVar2 = uVar2 ^ uVar17;
  uVar6 = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[0] = local_188[0] + uVar6;
  uVar14 = uVar14 ^ local_188[0];
  uVar9 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar2 = uVar3 + uVar15 + local_148[8];
  uVar7 = uVar7 ^ uVar2;
  uVar8 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[1] = local_188[1] + uVar8;
  uVar15 = uVar15 ^ local_188[1];
  uVar14 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar3 = uVar2 + local_148[0xb] + uVar14;
  uVar8 = uVar8 ^ uVar3;
  uVar8 = uVar8 << 0x30 | uVar8 >> 0x10;
  local_188[1] = local_188[1] + uVar8;
  uVar14 = uVar14 ^ local_188[1];
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar2 = uVar13 + uVar14 + local_148[0xd];
  uVar10 = uVar10 ^ uVar2;
  uVar15 = uVar10 << 0x20 | uVar10 >> 0x20;
  local_188[0] = local_188[0] + uVar15;
  uVar14 = uVar14 ^ local_188[0];
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar2 = uVar2 + local_148[0xb] + uVar14;
  uVar15 = uVar15 ^ uVar2;
  uVar7 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[0] = uVar7 + local_188[0];
  uVar14 = local_188[0] ^ uVar14;
  uVar10 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar14 = uVar4 + uVar12 + local_148[7];
  uVar6 = uVar6 ^ uVar14;
  uVar15 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[1] = local_188[1] + uVar15;
  uVar12 = uVar12 ^ local_188[1];
  uVar4 = uVar12 << 0x28 | uVar12 >> 0x18;
  uVar14 = uVar14 + uVar4 + local_148[0xe];
  uVar15 = uVar15 ^ uVar14;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[1] = uVar15 + local_188[1];
  uVar4 = local_188[1] ^ uVar4;
  uVar4 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar12 = uVar17 + uVar5 + local_148[0xc];
  uVar8 = uVar8 ^ uVar12;
  uVar6 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar5 = uVar5 ^ local_188[2];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar17 = uVar12 + uVar5 + local_148[1];
  uVar6 = uVar6 ^ uVar17;
  uVar6 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[2] = uVar6 + local_188[2];
  uVar5 = uVar5 ^ local_188[2];
  uVar8 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar3 = uVar3 + uVar9 + local_148[3];
  uVar16 = uVar16 ^ uVar3;
  uVar12 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_188[3] = local_188[3] + uVar12;
  uVar9 = uVar9 ^ local_188[3];
  uVar5 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar3 = uVar3 + uVar5 + local_148[9];
  uVar12 = uVar12 ^ uVar3;
  uVar9 = uVar12 << 0x30 | uVar12 >> 0x10;
  local_188[3] = local_188[3] + uVar9;
  uVar5 = uVar5 ^ local_188[3];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar2 = uVar2 + uVar4 + local_148[5];
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x20 | uVar9 >> 0x20;
  local_188[2] = local_188[2] + uVar9;
  uVar4 = uVar4 ^ local_188[2];
  uVar4 = uVar4 << 0x28 | uVar4 >> 0x18;
  uVar2 = uVar2 + uVar4 + local_148[0];
  uVar9 = uVar9 ^ uVar2;
  uVar16 = uVar9 << 0x30 | uVar9 >> 0x10;
  local_188[2] = uVar16 + local_188[2];
  uVar4 = local_188[2] ^ uVar4;
  uVar4 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar14 = uVar14 + local_148[0xf] + uVar8;
  uVar7 = uVar7 ^ uVar14;
  uVar7 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[3] = local_188[3] + uVar7;
  uVar8 = uVar8 ^ local_188[3];
  uVar8 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar14 = uVar14 + uVar8 + local_148[4];
  uVar7 = uVar7 ^ uVar14;
  uVar12 = uVar7 << 0x30 | uVar7 >> 0x10;
  local_188[3] = local_188[3] + uVar12;
  uVar8 = local_188[3] ^ uVar8;
  uVar9 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar8 = uVar17 + uVar5 + local_148[8];
  uVar15 = uVar15 ^ uVar8;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[0] = local_188[0] + uVar15;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar17 = uVar8 + local_148[6] + uVar5;
  uVar15 = uVar15 ^ uVar17;
  uVar8 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[0] = local_188[0] + uVar8;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar3 = uVar3 + uVar10 + local_148[2];
  uVar6 = uVar6 ^ uVar3;
  uVar15 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[1] = local_188[1] + uVar15;
  uVar10 = uVar10 ^ local_188[1];
  uVar6 = uVar10 << 0x28 | uVar10 >> 0x18;
  uVar3 = uVar3 + uVar6 + local_148[10];
  uVar15 = uVar15 ^ uVar3;
  uVar7 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[1] = local_188[1] + uVar7;
  uVar6 = uVar6 ^ local_188[1];
  uVar15 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar2 = local_148[6] + uVar15 + uVar2;
  uVar12 = uVar12 ^ uVar2;
  uVar6 = uVar12 << 0x20 | uVar12 >> 0x20;
  local_188[0] = local_188[0] + uVar6;
  uVar15 = uVar15 ^ local_188[0];
  uVar10 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar15 = uVar2 + local_148[0xf] + uVar10;
  uVar6 = uVar6 ^ uVar15;
  uVar12 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[0] = uVar12 + local_188[0];
  uVar10 = local_188[0] ^ uVar10;
  uVar10 = uVar10 << 1 | (ulong)((long)uVar10 < 0);
  uVar2 = uVar14 + uVar4 + local_148[0xe];
  uVar8 = uVar8 ^ uVar2;
  uVar6 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[1] = local_188[1] + uVar6;
  uVar4 = uVar4 ^ local_188[1];
  uVar4 = uVar4 << 0x28 | uVar4 >> 0x18;
  uVar14 = uVar2 + uVar4 + local_148[9];
  uVar6 = uVar6 ^ uVar14;
  uVar6 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[1] = uVar6 + local_188[1];
  uVar4 = local_188[1] ^ uVar4;
  uVar4 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar17 = uVar17 + uVar9 + local_148[0xb];
  uVar7 = uVar7 ^ uVar17;
  uVar2 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[2] = local_188[2] + uVar2;
  uVar9 = uVar9 ^ local_188[2];
  uVar8 = uVar9 << 0x28 | uVar9 >> 0x18;
  uVar17 = uVar17 + uVar8 + local_148[3];
  uVar2 = uVar2 ^ uVar17;
  uVar7 = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[2] = uVar7 + local_188[2];
  uVar8 = uVar8 ^ local_188[2];
  uVar8 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar2 = uVar3 + uVar5 + local_148[0];
  uVar16 = uVar16 ^ uVar2;
  uVar9 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_188[3] = local_188[3] + uVar9;
  uVar5 = uVar5 ^ local_188[3];
  uVar3 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar2 = uVar2 + uVar3 + local_148[8];
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x30 | uVar9 >> 0x10;
  local_188[3] = local_188[3] + uVar9;
  uVar3 = uVar3 ^ local_188[3];
  uVar5 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
  uVar3 = uVar15 + uVar4 + local_148[0xc];
  uVar9 = uVar9 ^ uVar3;
  uVar9 = uVar9 << 0x20 | uVar9 >> 0x20;
  local_188[2] = local_188[2] + uVar9;
  uVar4 = uVar4 ^ local_188[2];
  uVar4 = uVar4 << 0x28 | uVar4 >> 0x18;
  uVar15 = uVar3 + uVar4 + local_148[2];
  uVar9 = uVar9 ^ uVar15;
  uVar9 = uVar9 << 0x30 | uVar9 >> 0x10;
  local_188[2] = uVar9 + local_188[2];
  uVar4 = local_188[2] ^ uVar4;
  uVar4 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
  uVar14 = uVar14 + uVar8 + local_148[0xd];
  uVar12 = uVar12 ^ uVar14;
  uVar12 = uVar12 << 0x20 | uVar12 >> 0x20;
  local_188[3] = local_188[3] + uVar12;
  uVar8 = uVar8 ^ local_188[3];
  uVar3 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar14 = uVar14 + uVar3 + local_148[7];
  uVar12 = uVar12 ^ uVar14;
  uVar12 = uVar12 << 0x30 | uVar12 >> 0x10;
  local_188[3] = local_188[3] + uVar12;
  uVar3 = local_188[3] ^ uVar3;
  uVar3 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
  uVar8 = uVar17 + uVar5 + local_148[1];
  uVar6 = uVar6 ^ uVar8;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[0] = local_188[0] + uVar6;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar17 = uVar8 + local_148[4] + uVar5;
  uVar6 = uVar6 ^ uVar17;
  uVar8 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[0] = local_188[0] + uVar8;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar2 = uVar2 + uVar10 + local_148[10];
  uVar7 = uVar7 ^ uVar2;
  uVar6 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[1] = local_188[1] + uVar6;
  uVar10 = uVar10 ^ local_188[1];
  uVar10 = uVar10 << 0x28 | uVar10 >> 0x18;
  uVar2 = uVar2 + uVar10 + local_148[5];
  uVar6 = uVar6 ^ uVar2;
  uVar7 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[1] = local_188[1] + uVar7;
  uVar10 = uVar10 ^ local_188[1];
  uVar6 = uVar10 << 1 | (ulong)((long)uVar10 < 0);
  uVar15 = local_148[10] + uVar6 + uVar15;
  uVar12 = uVar12 ^ uVar15;
  uVar10 = uVar12 << 0x20 | uVar12 >> 0x20;
  local_188[0] = local_188[0] + uVar10;
  uVar6 = uVar6 ^ local_188[0];
  uVar12 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar6 = uVar15 + uVar12 + local_148[2];
  uVar10 = uVar10 ^ uVar6;
  uVar10 = uVar10 << 0x30 | uVar10 >> 0x10;
  local_188[0] = uVar10 + local_188[0];
  uVar12 = local_188[0] ^ uVar12;
  uVar16 = uVar12 << 1 | (ulong)((long)uVar12 < 0);
  uVar14 = uVar14 + uVar4 + local_148[8];
  uVar8 = uVar8 ^ uVar14;
  uVar8 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[1] = local_188[1] + uVar8;
  uVar4 = uVar4 ^ local_188[1];
  uVar15 = uVar4 << 0x28 | uVar4 >> 0x18;
  uVar14 = uVar14 + local_148[4] + uVar15;
  uVar8 = uVar8 ^ uVar14;
  uVar8 = uVar8 << 0x30 | uVar8 >> 0x10;
  local_188[1] = uVar8 + local_188[1];
  uVar15 = local_188[1] ^ uVar15;
  uVar4 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar12 = uVar17 + uVar3 + local_148[7];
  uVar7 = uVar7 ^ uVar12;
  uVar15 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[2] = local_188[2] + uVar15;
  uVar3 = uVar3 ^ local_188[2];
  uVar3 = uVar3 << 0x28 | uVar3 >> 0x18;
  uVar13 = uVar12 + uVar3 + local_148[6];
  uVar15 = uVar15 ^ uVar13;
  uVar7 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[2] = uVar7 + local_188[2];
  uVar3 = uVar3 ^ local_188[2];
  uVar17 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
  uVar2 = uVar2 + uVar5 + local_148[1];
  uVar9 = uVar9 ^ uVar2;
  uVar15 = uVar9 << 0x20 | uVar9 >> 0x20;
  local_188[3] = local_188[3] + uVar15;
  uVar5 = uVar5 ^ local_188[3];
  uVar3 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar2 = uVar2 + uVar3 + local_148[5];
  uVar15 = uVar15 ^ uVar2;
  uVar5 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_188[3] = local_188[3] + uVar5;
  uVar3 = uVar3 ^ local_188[3];
  uVar15 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
  uVar3 = uVar6 + uVar4 + local_148[0xf];
  uVar5 = uVar5 ^ uVar3;
  uVar6 = uVar5 << 0x20 | uVar5 >> 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar4 = uVar4 ^ local_188[2];
  uVar5 = uVar4 << 0x28 | uVar4 >> 0x18;
  uVar4 = uVar3 + uVar5 + local_148[0xb];
  uVar6 = uVar6 ^ uVar4;
  uVar12 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[2] = uVar12 + local_188[2];
  uVar5 = local_188[2] ^ uVar5;
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar14 = uVar14 + uVar17 + local_148[9];
  uVar10 = uVar10 ^ uVar14;
  uVar6 = uVar10 << 0x20 | uVar10 >> 0x20;
  local_188[3] = local_188[3] + uVar6;
  uVar17 = uVar17 ^ local_188[3];
  uVar3 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar14 = uVar14 + uVar3 + local_148[0xe];
  uVar6 = uVar6 ^ uVar14;
  uVar9 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[3] = local_188[3] + uVar9;
  uVar3 = local_188[3] ^ uVar3;
  uVar3 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
  uVar10 = uVar13 + local_148[3] + uVar15;
  uVar8 = uVar8 ^ uVar10;
  uVar6 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[0] = local_188[0] + uVar6;
  uVar15 = uVar15 ^ local_188[0];
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar17 = uVar10 + uVar15 + local_148[0xc];
  uVar6 = uVar6 ^ uVar17;
  uVar6 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[0] = local_188[0] + uVar6;
  uVar15 = uVar15 ^ local_188[0];
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar2 = uVar2 + uVar16 + local_148[0xd];
  uVar7 = uVar7 ^ uVar2;
  uVar8 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[1] = local_188[1] + uVar8;
  uVar16 = uVar16 ^ local_188[1];
  uVar7 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar2 = uVar2 + local_148[0] + uVar7;
  uVar8 = uVar8 ^ uVar2;
  uVar8 = uVar8 << 0x30 | uVar8 >> 0x10;
  local_188[1] = local_188[1] + uVar8;
  uVar7 = uVar7 ^ local_188[1];
  uVar10 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar4 = local_148[0] + uVar10 + uVar4;
  uVar9 = uVar9 ^ uVar4;
  uVar7 = uVar9 << 0x20 | uVar9 >> 0x20;
  local_188[0] = local_188[0] + uVar7;
  uVar10 = uVar10 ^ local_188[0];
  uVar9 = uVar10 << 0x28 | uVar10 >> 0x18;
  uVar4 = uVar4 + uVar9 + local_148[1];
  uVar7 = uVar7 ^ uVar4;
  uVar16 = uVar7 << 0x30 | uVar7 >> 0x10;
  local_188[0] = uVar16 + local_188[0];
  uVar9 = local_188[0] ^ uVar9;
  uVar10 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar14 = uVar14 + uVar5 + local_148[2];
  uVar6 = uVar6 ^ uVar14;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  local_188[1] = local_188[1] + uVar6;
  uVar5 = uVar5 ^ local_188[1];
  uVar5 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar14 = uVar14 + local_148[3] + uVar5;
  uVar6 = uVar6 ^ uVar14;
  uVar7 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[1] = uVar7 + local_188[1];
  uVar5 = local_188[1] ^ uVar5;
  uVar5 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar9 = uVar17 + uVar3 + local_148[4];
  uVar8 = uVar8 ^ uVar9;
  uVar6 = uVar8 << 0x20 | uVar8 >> 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar3 = uVar3 ^ local_188[2];
  uVar3 = uVar3 << 0x28 | uVar3 >> 0x18;
  uVar11 = uVar9 + uVar3 + local_148[5];
  uVar6 = uVar6 ^ uVar11;
  uVar9 = uVar6 << 0x30 | uVar6 >> 0x10;
  local_188[2] = uVar9 + local_188[2];
  uVar3 = uVar3 ^ local_188[2];
  uVar8 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
  uVar2 = uVar2 + uVar15 + local_148[6];
  uVar12 = uVar12 ^ uVar2;
  uVar3 = uVar12 << 0x20 | uVar12 >> 0x20;
  local_188[3] = local_188[3] + uVar3;
  uVar15 = uVar15 ^ local_188[3];
  uVar6 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar2 = uVar2 + uVar6 + local_148[7];
  uVar3 = uVar3 ^ uVar2;
  uVar15 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[3] = local_188[3] + uVar15;
  uVar6 = uVar6 ^ local_188[3];
  uVar13 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar3 = uVar4 + uVar5 + local_148[8];
  uVar15 = uVar15 ^ uVar3;
  uVar4 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_188[2] = local_188[2] + uVar4;
  uVar5 = uVar5 ^ local_188[2];
  uVar15 = uVar5 << 0x28 | uVar5 >> 0x18;
  uVar5 = uVar3 + uVar15 + local_148[9];
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[2] = uVar4 + local_188[2];
  uVar15 = local_188[2] ^ uVar15;
  uVar6 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar3 = uVar14 + local_148[10] + uVar8;
  uVar16 = uVar16 ^ uVar3;
  uVar12 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_188[3] = local_188[3] + uVar12;
  uVar8 = uVar8 ^ local_188[3];
  uVar15 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar14 = uVar3 + uVar15 + local_148[0xb];
  uVar12 = uVar12 ^ uVar14;
  uVar16 = uVar12 << 0x30 | uVar12 >> 0x10;
  local_188[3] = local_188[3] + uVar16;
  uVar15 = local_188[3] ^ uVar15;
  uVar17 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar8 = uVar11 + uVar13 + local_148[0xc];
  uVar7 = uVar7 ^ uVar8;
  uVar3 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar13 = uVar13 ^ local_188[0];
  uVar15 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar13 = uVar8 + uVar15 + local_148[0xd];
  uVar3 = uVar3 ^ uVar13;
  uVar7 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[0] = local_188[0] + uVar7;
  uVar15 = uVar15 ^ local_188[0];
  uVar8 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar2 = uVar2 + uVar10 + local_148[0xe];
  uVar9 = uVar9 ^ uVar2;
  uVar3 = uVar9 << 0x20 | uVar9 >> 0x20;
  local_188[1] = local_188[1] + uVar3;
  uVar10 = uVar10 ^ local_188[1];
  uVar9 = uVar10 << 0x28 | uVar10 >> 0x18;
  uVar15 = uVar2 + local_148[0xf] + uVar9;
  uVar3 = uVar3 ^ uVar15;
  uVar12 = uVar3 << 0x30 | uVar3 >> 0x10;
  local_188[1] = local_188[1] + uVar12;
  uVar9 = uVar9 ^ local_188[1];
  uVar3 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar5 = local_148[0xe] + uVar3 + uVar5;
  uVar16 = uVar16 ^ uVar5;
  uVar2 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_188[0] = local_188[0] + uVar2;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 << 0x28 | uVar3 >> 0x18;
  uVar10 = uVar5 + local_148[10] + uVar3;
  uVar2 = uVar2 ^ uVar10;
  uVar9 = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[0] = uVar9 + local_188[0];
  uVar3 = local_188[0] ^ uVar3;
  uVar3 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
  uVar2 = uVar14 + uVar6 + local_148[4];
  uVar7 = uVar7 ^ uVar2;
  uVar7 = uVar7 << 0x20 | uVar7 >> 0x20;
  local_188[1] = local_188[1] + uVar7;
  uVar6 = uVar6 ^ local_188[1];
  uVar14 = uVar6 << 0x28 | uVar6 >> 0x18;
  uVar5 = uVar2 + uVar14 + local_148[8];
  uVar7 = uVar7 ^ uVar5;
  uVar2 = uVar7 << 0x30 | uVar7 >> 0x10;
  local_188[1] = uVar2 + local_188[1];
  uVar14 = local_188[1] ^ uVar14;
  uVar7 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar6 = uVar13 + uVar17 + local_148[9];
  uVar12 = uVar12 ^ uVar6;
  uVar14 = uVar12 << 0x20 | uVar12 >> 0x20;
  local_188[2] = local_188[2] + uVar14;
  uVar17 = uVar17 ^ local_188[2];
  uVar12 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar16 = uVar6 + local_148[0xf] + uVar12;
  uVar14 = uVar14 ^ uVar16;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  uVar15 = uVar15 + uVar8 + local_148[0xd];
  uVar4 = uVar4 ^ uVar15;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[3] = local_188[3] + uVar4;
  uVar8 = uVar8 ^ local_188[3];
  uVar6 = uVar8 << 0x28 | uVar8 >> 0x18;
  uVar15 = uVar15 + uVar6 + local_148[6];
  local_188[2] = uVar14 + local_188[2];
  uVar4 = uVar4 ^ uVar15;
  uVar4 = uVar4 << 0x30 | uVar4 >> 0x10;
  uVar12 = uVar12 ^ local_188[2];
  uVar10 = uVar10 + uVar7 + local_148[1];
  local_188[3] = local_188[3] + uVar4;
  uVar4 = uVar4 ^ uVar10;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  local_188[2] = local_188[2] + uVar4;
  uVar7 = uVar7 ^ local_188[2];
  uVar8 = uVar7 << 0x28 | uVar7 >> 0x18;
  local_1c8[0] = uVar10 + uVar8 + local_148[0xc];
  uVar4 = local_1c8[0] ^ uVar4;
  local_188[7] = uVar4 << 0x30 | uVar4 >> 0x10;
  local_188[2] = local_188[7] + local_188[2];
  uVar7 = uVar12 << 1 | (ulong)((long)uVar12 < 0);
  local_188[2] = local_188[2] ^ uVar8;
  uVar6 = uVar6 ^ local_188[3];
  local_1c8[5] = local_188[2] << 1 | (ulong)((long)local_188[2] < 0);
  uVar4 = uVar5 + uVar7 + local_148[0];
  uVar9 = uVar9 ^ uVar4;
  uVar5 = uVar9 << 0x20 | uVar9 >> 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar7 = uVar7 ^ local_188[3];
  uVar8 = uVar7 << 0x28 | uVar7 >> 0x18;
  local_1c8[1] = uVar4 + uVar8 + local_148[2];
  uVar5 = local_1c8[1] ^ uVar5;
  local_188[4] = uVar5 << 0x30 | uVar5 >> 0x10;
  local_188[3] = local_188[4] + local_188[3];
  uVar4 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  local_188[3] = local_188[3] ^ uVar8;
  local_1c8[6] = local_188[3] << 1 | (ulong)((long)local_188[3] < 0);
  uVar5 = uVar16 + uVar4 + local_148[0xb];
  uVar2 = uVar2 ^ uVar5;
  uVar2 = uVar2 << 0x20 | uVar2 >> 0x20;
  local_188[0] = local_188[0] + uVar2;
  uVar4 = uVar4 ^ local_188[0];
  uVar4 = uVar4 << 0x28 | uVar4 >> 0x18;
  local_1c8[2] = uVar5 + uVar4 + local_148[7];
  uVar2 = local_1c8[2] ^ uVar2;
  local_188[5] = uVar2 << 0x30 | uVar2 >> 0x10;
  local_188[0] = local_188[5] + local_188[0];
  local_188[0] = local_188[0] ^ uVar4;
  local_1c8[7] = local_188[0] << 1 | (ulong)((long)local_188[0] < 0);
  uVar15 = uVar15 + uVar3 + local_148[5];
  uVar14 = uVar14 ^ uVar15;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_188[1] = local_188[1] + uVar14;
  uVar3 = uVar3 ^ local_188[1];
  uVar2 = uVar3 << 0x28 | uVar3 >> 0x18;
  local_1c8[3] = uVar15 + uVar2 + local_148[3];
  uVar14 = local_1c8[3] ^ uVar14;
  local_188[6] = uVar14 << 0x30 | uVar14 >> 0x10;
  local_188[1] = local_188[6] + local_188[1];
  local_188[1] = local_188[1] ^ uVar2;
  local_1c8[4] = local_188[1] << 1 | (ulong)((long)local_188[1] < 0);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    S->h[lVar1] = local_1c8[lVar1] ^ S->h[lVar1] ^ local_188[lVar1];
  }
  return 8;
}

Assistant:

static int blake2b_compress( blake2b_state *S, const uint8_t block[BLAKE2B_BLOCKBYTES] )
{
  uint64_t m[16];
  uint64_t v[16];
  int i;

  for( i = 0; i < 16; ++i )
    m[i] = load64( block + i * sizeof( m[i] ) );

  for( i = 0; i < 8; ++i )
    v[i] = S->h[i];

  v[ 8] = blake2b_IV[0];
  v[ 9] = blake2b_IV[1];
  v[10] = blake2b_IV[2];
  v[11] = blake2b_IV[3];
  v[12] = S->t[0] ^ blake2b_IV[4];
  v[13] = S->t[1] ^ blake2b_IV[5];
  v[14] = S->f[0] ^ blake2b_IV[6];
  v[15] = S->f[1] ^ blake2b_IV[7];
#define G(r,i,a,b,c,d) \
  do { \
    a = a + b + m[blake2b_sigma[r][2*i+0]]; \
    d = rotr64(d ^ a, 32); \
    c = c + d; \
    b = rotr64(b ^ c, 24); \
    a = a + b + m[blake2b_sigma[r][2*i+1]]; \
    d = rotr64(d ^ a, 16); \
    c = c + d; \
    b = rotr64(b ^ c, 63); \
  } while(0)
#define ROUND(r)  \
  do { \
    G(r,0,v[ 0],v[ 4],v[ 8],v[12]); \
    G(r,1,v[ 1],v[ 5],v[ 9],v[13]); \
    G(r,2,v[ 2],v[ 6],v[10],v[14]); \
    G(r,3,v[ 3],v[ 7],v[11],v[15]); \
    G(r,4,v[ 0],v[ 5],v[10],v[15]); \
    G(r,5,v[ 1],v[ 6],v[11],v[12]); \
    G(r,6,v[ 2],v[ 7],v[ 8],v[13]); \
    G(r,7,v[ 3],v[ 4],v[ 9],v[14]); \
  } while(0)
  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );
  ROUND( 10 );
  ROUND( 11 );

  for( i = 0; i < 8; ++i )
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];

#undef G
#undef ROUND
  return 0;
}